

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O3

ValueLength __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
objectLength(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  uint uVar1;
  long lVar2;
  ValueLength VVar3;
  ulong uVar4;
  byte bVar5;
  byte *pbVar6;
  byte *pbVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  pbVar7 = *(byte **)this;
  bVar5 = *pbVar7;
  if (bVar5 == 10) {
switchD_001107b1_default:
    return 0;
  }
  if (bVar5 == 0x14) {
    bVar5 = 0;
    lVar2 = 0;
    pbVar6 = pbVar7;
    do {
      lVar10 = lVar2;
      pbVar6 = pbVar6 + 1;
      lVar9 = (ulong)(*pbVar6 & 0x7f) << (bVar5 & 0x3f);
      bVar5 = bVar5 + 7;
      lVar2 = lVar10 + lVar9;
    } while ((char)*pbVar6 < '\0');
    pbVar7 = pbVar7 + lVar9 + lVar10;
    VVar3 = 0;
    bVar5 = 0;
    do {
      pbVar7 = pbVar7 + -1;
      VVar3 = VVar3 + ((ulong)(*pbVar7 & 0x7f) << (bVar5 & 0x3f));
      bVar5 = bVar5 + 7;
    } while ((char)*pbVar7 < '\0');
    return VVar3;
  }
  uVar1 = SliceStaticData::WidthMap[bVar5];
  uVar4 = (ulong)uVar1;
  if (7 < uVar4) {
    if (uVar1 != 8) {
      return 0;
    }
    return *(ValueLength *)(pbVar7 + (*(long *)(pbVar7 + 1) - uVar4));
  }
  switch(uVar1) {
  case 1:
    return (ulong)pbVar7[uVar4 + 1];
  case 2:
    return (ulong)*(ushort *)(pbVar7 + uVar4 + 1);
  case 3:
    uVar8 = (ulong)pbVar7[uVar4 + 1];
    uVar4 = (ulong)*(ushort *)(pbVar7 + uVar4 + 2) << 8;
    goto LAB_001107fe;
  case 4:
    return (ulong)*(uint *)(pbVar7 + uVar4 + 1);
  case 5:
    uVar1 = *(uint *)(pbVar7 + uVar4 + 1);
    uVar4 = (ulong)pbVar7[uVar4 + 5];
    break;
  case 6:
    uVar1 = *(uint *)(pbVar7 + uVar4 + 1);
    uVar4 = (ulong)*(ushort *)(pbVar7 + uVar4 + 5);
    break;
  case 7:
    return (ulong)CONCAT34(CONCAT12(pbVar7[uVar4 + 7],*(undefined2 *)(pbVar7 + uVar4 + 5)),
                           *(undefined4 *)(pbVar7 + uVar4 + 1));
  default:
    goto switchD_001107b1_default;
  }
  uVar8 = (ulong)uVar1;
  uVar4 = uVar4 << 0x20;
LAB_001107fe:
  return uVar4 | uVar8;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }